

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HatchetSampleProfileController.cpp
# Opt level: O0

ChannelController *
anon_unknown.dwarf_4175f1::make_controller(char *name,config_map_t *initial_cfg,Options *opts)

{
  bool use_mpi;
  ChannelController *this;
  Options *opts_local;
  config_map_t *initial_cfg_local;
  char *name_local;
  
  this = (ChannelController *)operator_new(0x18);
  use_mpi = anon_unknown.dwarf_4175f1::use_mpi(opts);
  RocmActivityReportController::RocmActivityReportController
            ((RocmActivityReportController *)this,use_mpi,name,initial_cfg,opts);
  return this;
}

Assistant:

cali::ChannelController* make_controller(
    const char*                         name,
    const config_map_t&                 initial_cfg,
    const cali::ConfigManager::Options& opts
)
{
    std::string format = opts.get("output.format", "cali");

    if (format == "hatchet")
        format = "cali";

    if (!(format == "json-split" || format == "json" || format == "cali")) {
        format = "json-split";
        Log(0).stream() << "hatchet-region-profile: Unknown output format \"" << format << "\". Using json-split."
                        << std::endl;
    }

    return new HatchetSampleProfileController(name, initial_cfg, opts, format);
}